

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.cc
# Opt level: O3

int pkcs7_bundle_raw_certificates_cb(CBB *out,void *arg)

{
  int iVar1;
  size_t sVar2;
  CRYPTO_BUFFER *buf;
  uint8_t *data;
  size_t sVar3;
  uint uVar4;
  CBB certificates;
  CBB local_60;
  
  iVar1 = CBB_add_asn1(out,&local_60,0xa0000000);
  uVar4 = 0;
  if (iVar1 != 0) {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)arg);
    if (sVar2 != 0) {
      sVar2 = 0;
      do {
        buf = (CRYPTO_BUFFER *)OPENSSL_sk_value((OPENSSL_STACK *)arg,sVar2);
        data = CRYPTO_BUFFER_data(buf);
        sVar3 = CRYPTO_BUFFER_len(buf);
        iVar1 = CBB_add_bytes(&local_60,data,sVar3);
        if (iVar1 == 0) {
          return 0;
        }
        sVar2 = sVar2 + 1;
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)arg);
      } while (sVar2 < sVar3);
    }
    iVar1 = CBB_flush_asn1_set_of(&local_60);
    if (iVar1 != 0) {
      iVar1 = CBB_flush(out);
      uVar4 = (uint)(iVar1 != 0);
    }
  }
  return uVar4;
}

Assistant:

static int pkcs7_bundle_raw_certificates_cb(CBB *out, void *arg) {
  const STACK_OF(CRYPTO_BUFFER) *certs =
      reinterpret_cast<const STACK_OF(CRYPTO_BUFFER) *>(arg);
  CBB certificates;

  // See https://tools.ietf.org/html/rfc2315#section-9.1
  if (!CBB_add_asn1(out, &certificates,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    return 0;
  }

  for (size_t i = 0; i < sk_CRYPTO_BUFFER_num(certs); i++) {
    CRYPTO_BUFFER *cert = sk_CRYPTO_BUFFER_value(certs, i);
    if (!CBB_add_bytes(&certificates, CRYPTO_BUFFER_data(cert),
                       CRYPTO_BUFFER_len(cert))) {
      return 0;
    }
  }

  // |certificates| is a implicitly-tagged SET OF.
  return CBB_flush_asn1_set_of(&certificates) && CBB_flush(out);
}